

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t height_;
  char *message;
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  *this_00;
  undefined4 in_EDX;
  Image *in_RSI;
  AbstractTaskProvider *in_RDI;
  uint32_t in_R9D;
  uint32_t in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac
             ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  bVar1 = AbstractTaskProvider::_ready(in_RDI);
  if (!bVar1) {
    message = (char *)__cxa_allocate_exception(0x28);
    imageException::imageException((imageException *)in_RDI,message);
    __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
  }
  this_00 = (unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)operator_new(0x68);
  height_ = anon_unknown.dwarf_899bb::threadCount();
  InputImageInfo::InputImageInfo
            ((InputImageInfo *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),in_RSI,
             (uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,in_stack_ffffffffffffff8c,height_,
             in_R9D);
  std::unique_ptr<Function_Pool::InputImageInfo,std::default_delete<Function_Pool::InputImageInfo>>
  ::unique_ptr<std::default_delete<Function_Pool::InputImageInfo>,void>
            (this_00,(pointer)CONCAT44(in_stack_ffffffffffffff8c,height_));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator=(this_00,(unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                     *)CONCAT44(in_stack_ffffffffffffff8c,height_));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr(this_00);
  return;
}

Assistant:

void FunctionPoolTask::_setup( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( image, x, y, width, height, threadCount() ) );
    }